

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O0

int sp_dtrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,double *x,
            SuperLUStat_t *stat,int *info)

{
  int iVar1;
  int iVar2;
  double *Mxvec;
  char local_1b8 [8];
  char msg [256];
  int ii;
  flops_t solve_ops;
  double *work;
  int local_a0;
  int_t iptr;
  int_t k;
  int_t i;
  int_t istart;
  int_t luptr;
  int nsupc;
  int nsupr;
  int fsupc;
  int jcol;
  int irow;
  int nrow;
  double beta;
  double alpha;
  int incy;
  int incx;
  double *Uval;
  double *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  double *x_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  char *diag_local;
  char *trans_local;
  char *uplo_local;
  
  alpha._4_4_ = 1;
  alpha._0_4_ = 1;
  beta = 1.0;
  _irow = 0x3ff0000000000000;
  *info = 0;
  Lstore = (SCformat *)x;
  x_local = (double *)U;
  U_local = L;
  L_local = (SuperMatrix *)diag;
  diag_local = trans;
  trans_local = uplo;
  iVar2 = strncmp(uplo,"L",1);
  if ((iVar2 == 0) || (iVar2 = strncmp(trans_local,"U",1), iVar2 == 0)) {
    iVar2 = strncmp(diag_local,"N",1);
    if ((iVar2 == 0) ||
       ((iVar2 = strncmp(diag_local,"T",1), iVar2 == 0 ||
        (iVar2 = strncmp(diag_local,"C",1), iVar2 == 0)))) {
      iVar2 = strncmp((char *)L_local,"U",1);
      if ((iVar2 == 0) || (iVar2 = strncmp((char *)L_local,"N",1), iVar2 == 0)) {
        if ((U_local->nrow == U_local->ncol) && (-1 < U_local->nrow)) {
          if ((*(int *)((long)x_local + 0xc) != *(int *)(x_local + 2)) ||
             (*(int *)((long)x_local + 0xc) < 0)) {
            *info = -5;
          }
        }
        else {
          *info = -4;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    Ustore = (NCformat *)U_local->Store;
    Uval = (double *)Ustore->nzval;
    Lval = (double *)x_local[3];
    _incy = Lval[1];
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    Mxvec = doubleCalloc((long)U_local->nrow);
    if (Mxvec == (double *)0x0) {
      sprintf(local_1b8,"%s at line %d in file %s\n","Malloc fails for work in sp_dtrsv().",0x7f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c"
             );
      superlu_abort_and_exit(local_1b8);
    }
    iVar2 = strncmp(diag_local,"N",1);
    if (iVar2 == 0) {
      iVar2 = strncmp(trans_local,"L",1);
      if (iVar2 == 0) {
        if (U_local->nrow == 0) {
          return 0;
        }
        for (local_a0 = 0; local_a0 <= *(int *)&Ustore->field_0x4; local_a0 = local_a0 + 1) {
          nsupc = Ustore[1].rowind[local_a0];
          work._4_4_ = *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) - work._4_4_;
          istart = Ustore[1].rowind[local_a0 + 1] - nsupc;
          i = Ustore->rowind[nsupc];
          jcol = luptr - istart;
          msg._252_4_ = (float)(jcol * 2 * istart) +
                        (float)(istart * (istart + -1)) + (float)msg._252_4_;
          if (istart == 1) {
            while (work._4_4_ = work._4_4_ + 1,
                  work._4_4_ < *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4)) {
              fsupc = Ustore->colptr[work._4_4_];
              i = i + 1;
              *(double *)(&Lstore->nnz + (long)fsupc * 2) =
                   -*(double *)(&Lstore->nnz + (long)nsupc * 2) * Uval[i] +
                   *(double *)(&Lstore->nnz + (long)fsupc * 2);
            }
          }
          else {
            dlsolve(luptr,istart,Uval + i,(double *)(&Lstore->nnz + (long)nsupc * 2));
            dmatvec(luptr,luptr - istart,istart,Uval + (i + istart),
                    (double *)(&Lstore->nnz + (long)nsupc * 2),Mxvec);
            work._4_4_ = work._4_4_ + istart;
            for (iptr = 0; iptr < jcol; iptr = iptr + 1) {
              fsupc = Ustore->colptr[work._4_4_];
              *(double *)(&Lstore->nnz + (long)fsupc * 2) =
                   *(double *)(&Lstore->nnz + (long)fsupc * 2) - Mxvec[iptr];
              Mxvec[iptr] = 0.0;
              work._4_4_ = work._4_4_ + 1;
            }
          }
        }
      }
      else {
        if (*(int *)((long)x_local + 0xc) == 0) {
          return 0;
        }
        for (local_a0 = *(int *)&Ustore->field_0x4; -1 < local_a0; local_a0 = local_a0 + -1) {
          nsupc = Ustore[1].rowind[local_a0];
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) -
                  *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          istart = Ustore[1].rowind[local_a0 + 1] - nsupc;
          msg._252_4_ = (float)(istart * (istart + 1)) + (float)msg._252_4_;
          if (istart == 1) {
            *(double *)(&Lstore->nnz + (long)nsupc * 2) =
                 *(double *)(&Lstore->nnz + (long)nsupc * 2) / Uval[Ustore->rowind[nsupc]];
            for (iptr = *(int_t *)((long)Lval[3] + (long)nsupc * 4);
                iptr < *(int *)((long)Lval[3] + (long)(nsupc + 1) * 4); iptr = iptr + 1) {
              fsupc = *(int *)((long)Lval[2] + (long)iptr * 4);
              *(double *)(&Lstore->nnz + (long)fsupc * 2) =
                   -*(double *)(&Lstore->nnz + (long)nsupc * 2) *
                   *(double *)((long)_incy + (long)iptr * 8) +
                   *(double *)(&Lstore->nnz + (long)fsupc * 2);
            }
          }
          else {
            dusolve(luptr,istart,Uval + Ustore->rowind[nsupc],
                    (double *)(&Lstore->nnz + (long)nsupc * 2));
            for (nsupr = nsupc; nsupr < Ustore[1].rowind[local_a0 + 1]; nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)((long)Lval[3] + (long)(nsupr + 1) * 4) -
                                    *(int *)((long)Lval[3] + (long)nsupr * 4)) * 2) +
                            (float)msg._252_4_;
              for (iptr = *(int_t *)((long)Lval[3] + (long)nsupr * 4);
                  iptr < *(int *)((long)Lval[3] + (long)(nsupr + 1) * 4); iptr = iptr + 1) {
                fsupc = *(int *)((long)Lval[2] + (long)iptr * 4);
                *(double *)(&Lstore->nnz + (long)fsupc * 2) =
                     -*(double *)(&Lstore->nnz + (long)nsupr * 2) *
                     *(double *)((long)_incy + (long)iptr * 8) +
                     *(double *)(&Lstore->nnz + (long)fsupc * 2);
              }
            }
          }
        }
      }
    }
    else {
      iVar2 = strncmp(trans_local,"L",1);
      if (iVar2 == 0) {
        if (U_local->nrow == 0) {
          return 0;
        }
        for (local_a0 = *(int *)&Ustore->field_0x4; -1 < local_a0; local_a0 = local_a0 + -1) {
          nsupc = Ustore[1].rowind[local_a0];
          iVar2 = *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) - iVar2;
          istart = Ustore[1].rowind[local_a0 + 1] - nsupc;
          iVar1 = Ustore->rowind[nsupc];
          msg._252_4_ = (float)((luptr - istart) * 2 * istart) + (float)msg._252_4_;
          for (nsupr = nsupc; nsupr < Ustore[1].rowind[local_a0 + 1]; nsupr = nsupr + 1) {
            work._4_4_ = iVar2 + istart;
            for (iptr = Ustore->rowind[nsupr] + istart; iptr < Ustore->rowind[nsupr + 1];
                iptr = iptr + 1) {
              fsupc = Ustore->colptr[work._4_4_];
              *(double *)(&Lstore->nnz + (long)nsupr * 2) =
                   -*(double *)(&Lstore->nnz + (long)fsupc * 2) * Uval[iptr] +
                   *(double *)(&Lstore->nnz + (long)nsupr * 2);
              work._4_4_ = work._4_4_ + 1;
            }
          }
          if (1 < istart) {
            msg._252_4_ = (float)(istart * (istart + -1)) + (float)msg._252_4_;
            dtrsv_("L","T","U",&istart,Uval + iVar1,&luptr,
                   (doublereal *)(&Lstore->nnz + (long)nsupc * 2),(integer *)((long)&alpha + 4));
          }
        }
      }
      else {
        if (*(int *)((long)x_local + 0xc) == 0) {
          return 0;
        }
        for (local_a0 = 0; local_a0 <= *(int *)&Ustore->field_0x4; local_a0 = local_a0 + 1) {
          nsupc = Ustore[1].rowind[local_a0];
          luptr = *(int *)(*(long *)(Ustore + 1) + (long)(nsupc + 1) * 4) -
                  *(int *)(*(long *)(Ustore + 1) + (long)nsupc * 4);
          istart = Ustore[1].rowind[local_a0 + 1] - nsupc;
          iVar2 = Ustore->rowind[nsupc];
          for (nsupr = nsupc; nsupr < Ustore[1].rowind[local_a0 + 1]; nsupr = nsupr + 1) {
            msg._252_4_ = (float)((*(int *)((long)Lval[3] + (long)(nsupr + 1) * 4) -
                                  *(int *)((long)Lval[3] + (long)nsupr * 4)) * 2) +
                          (float)msg._252_4_;
            for (iptr = *(int_t *)((long)Lval[3] + (long)nsupr * 4);
                iptr < *(int *)((long)Lval[3] + (long)(nsupr + 1) * 4); iptr = iptr + 1) {
              fsupc = *(int *)((long)Lval[2] + (long)iptr * 4);
              *(double *)(&Lstore->nnz + (long)nsupr * 2) =
                   -*(double *)(&Lstore->nnz + (long)fsupc * 2) *
                   *(double *)((long)_incy + (long)iptr * 8) +
                   *(double *)(&Lstore->nnz + (long)nsupr * 2);
            }
          }
          msg._252_4_ = (float)(istart * (istart + 1)) + (float)msg._252_4_;
          if (istart == 1) {
            *(double *)(&Lstore->nnz + (long)nsupc * 2) =
                 *(double *)(&Lstore->nnz + (long)nsupc * 2) / Uval[iVar2];
          }
          else {
            dtrsv_("U","T","N",&istart,Uval + iVar2,&luptr,
                   (doublereal *)(&Lstore->nnz + (long)nsupc * 2),(integer *)((long)&alpha + 4));
          }
        }
      }
    }
    stat->ops[0x11] = (float)msg._252_4_ + stat->ops[0x11];
    superlu_free(Mxvec);
    return 0;
  }
  msg._248_4_ = -*info;
  input_error("sp_dtrsv",(int *)(msg + 0xf8));
  return 0;
}

Assistant:

int
sp_dtrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, double *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    double   *Lval, *Uval;
    int incx = 1, incy = 1;
    double alpha = 1.0, beta = 1.0;
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    double *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_dtrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doubleCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_dtrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

	        solve_ops += nsupc * (nsupc - 1);
	        solve_ops += 2 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			x[irow] -= x[fsupc] * Lval[luptr];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    SGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    dtrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    dgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    dlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    dmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			x[irow] -= work[i];	/* Scatter */
			work[i] = 0.0;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
    	        solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			x[irow] -= x[fsupc] * Uval[i];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    dtrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    dusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			    x[irow] -= x[jcol] * Uval[i];
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 2 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			x[jcol] -= x[irow] * Lval[i];
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    dtrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			x[jcol] -= x[irow] * Uval[i];
		    }
		}

		solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    dtrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}